

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

DirPathPair * __thiscall
capnp::compiler::CompilerMain::interpretSourceFile
          (DirPathPair *__return_storage_ptr__,CompilerMain *this,StringPtr pathStr)

{
  OutputDirective *pOVar1;
  ProcessContext *pPVar2;
  long lVar3;
  PathPtr prefix;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar6;
  size_t extraout_RDX;
  void *__child_stack;
  String *pSVar7;
  OutputDirective *pOVar8;
  char *pcVar9;
  undefined1 auVar10 [8];
  void *in_R8;
  size_t __n;
  DirPathPair *pDVar11;
  long lVar12;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Path path;
  Fault f;
  PathPtr cwd;
  undefined1 local_e8 [8];
  undefined8 uStack_e0;
  ArrayDisposer *local_d8;
  size_t local_d0;
  bool local_c8;
  Path local_b8;
  String local_98;
  DirPathPair *local_78;
  ArrayPtr<const_char> *local_70;
  size_t local_68;
  PathPtr local_60;
  ArrayPtr<const_char> *local_50;
  long local_48;
  ArrayPtr<const_char> local_40;
  
  local_78 = __return_storage_ptr__;
  iVar5 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
  local_60.parts.ptr = (String *)CONCAT44(extraout_var,iVar5);
  local_70 = (ArrayPtr<const_char> *)pathStr.content.ptr;
  local_68 = pathStr.content.size_;
  local_60.parts.size_ = extraout_RDX;
  kj::PathPtr::eval(&local_b8,&local_60,pathStr);
  local_e8 = (undefined1  [8])local_b8.parts.size_;
  uStack_e0 = (String *)((ulong)uStack_e0._4_4_ << 0x20);
  local_d8 = (ArrayDisposer *)0x20f38f;
  local_d0 = 4;
  local_c8 = (String *)local_b8.parts.size_ != (String *)0x0;
  if ((String *)local_b8.parts.size_ == (String *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x7bb,FAILED,"path.size() > 0","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_e8);
    kj::_::Debug::Fault::fatal((Fault *)&local_98);
  }
  pSVar7 = (String *)((long)&(((String *)(local_b8.parts.size_ + -0x18))->content).disposer + 7);
  if (pSVar7 != (String *)0x0) {
    lVar12 = 1 - local_b8.parts.size_;
    lVar3 = local_b8.parts.size_ * 0x18;
    do {
      local_e8 = (undefined1  [8])local_b8.parts.ptr;
      local_98.content.ptr = (char *)((long)&local_b8.parts.ptr[-1].content.ptr + lVar3);
      sVar6 = (long)&((Array<char> *)local_b8.parts.size_)->ptr + lVar12;
      uStack_e0 = pSVar7;
      local_98.content.size_ = sVar6;
      kj::
      Table<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>>
      ::find<0ul,kj::PathPtr&>
                ((Table<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>>
                  *)&local_50,(PathPtr *)&this->sourceDirectories);
      pDVar11 = local_78;
      if ((local_50 != (ArrayPtr<const_char> *)0x0) && ((char)local_50[2].size_ == '\x01')) {
        local_78->dir = (ReadableDirectory *)local_50[2].ptr;
        kj::PathPtr::clone((PathPtr *)&local_78->path,(__fn *)&local_98,__child_stack,(int)sVar6,
                           in_R8);
        goto LAB_0011a9ac;
      }
      pSVar7 = (String *)((long)&pSVar7[-1].content.disposer + 7);
      lVar12 = lVar12 + 1;
      lVar3 = lVar3 + -0x18;
    } while (lVar12 != 0);
  }
  prefix.parts.size_ = local_60.parts.size_;
  prefix.parts.ptr = local_60.parts.ptr;
  local_e8 = (undefined1  [8])local_b8.parts.ptr;
  uStack_e0 = (String *)local_b8.parts.size_;
  bVar4 = kj::PathPtr::startsWith((PathPtr *)local_e8,prefix);
  pDVar11 = local_78;
  if (bVar4) {
    iVar5 = (*((this->disk).ptr)->_vptr_Filesystem[1])();
    pDVar11->dir = (ReadableDirectory *)CONCAT44(extraout_var_00,iVar5);
    local_e8 = (undefined1  [8])(local_b8.parts.ptr + local_60.parts.size_);
    uStack_e0 = (String *)(local_b8.parts.size_ - local_60.parts.size_);
    kj::PathPtr::clone((PathPtr *)&pDVar11->path,(__fn *)local_e8,(void *)local_e8,(int)uStack_e0,
                       in_R8);
  }
  else {
    pOVar8 = (this->outputs).builder.ptr;
    pOVar1 = (this->outputs).builder.pos;
    if (pOVar8 != pOVar1) {
      do {
        pcVar9 = (pOVar8->name).ptr;
        sVar6 = (pOVar8->name).size_;
        kj::heapString((String *)local_e8,sVar6);
        if (sVar6 != 0) {
          auVar10 = (undefined1  [8])uStack_e0;
          if (uStack_e0 != (String *)0x0) {
            auVar10 = local_e8;
          }
          memcpy((void *)auVar10,pcVar9,sVar6);
        }
        pSVar7 = uStack_e0;
        __n = (long)&(uStack_e0->content).ptr + (ulong)(uStack_e0 == (String *)0x0);
        if (uStack_e0 != (String *)0x6) {
          if (uStack_e0 == (String *)0x2) {
            iVar5 = bcmp((void *)local_e8,"-",__n);
            auVar10 = local_e8;
            goto joined_r0x0011a829;
          }
LAB_0011a8a7:
          pPVar2 = this->context;
          local_48 = local_68 - 1;
          local_50 = local_70;
          local_40.ptr = 
          ": File is not in the current directory and does not match any prefix defined with --src-prefix. Please pass an appropriate --src-prefix so I can figure out where to write the output for this file."
          ;
          local_40.size_ = 0xc4;
          kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                    (&local_98,(_ *)&local_50,&local_40,local_70);
          pcVar9 = local_98.content.ptr;
          if (local_98.content.size_ == 0) {
            pcVar9 = "";
          }
          (*pPVar2->_vptr_ProcessContext[2])
                    (pPVar2,pcVar9,local_98.content.size_ + (local_98.content.size_ == 0));
          sVar6 = local_98.content.size_;
          pcVar9 = local_98.content.ptr;
          if (local_98.content.ptr != (char *)0x0) {
            local_98.content.ptr = (char *)0x0;
            local_98.content.size_ = 0;
            (**(local_98.content.disposer)->_vptr_ArrayDisposer)
                      (local_98.content.disposer,pcVar9,1,sVar6,sVar6,0);
          }
          pSVar7 = uStack_e0;
          auVar10 = local_e8;
          if (local_e8 != (undefined1  [8])0x0) {
            local_e8 = (undefined1  [8])0x0;
            uStack_e0 = (String *)0x0;
            (**local_d8->_vptr_ArrayDisposer)(local_d8,auVar10,1,pSVar7,pSVar7,0);
          }
          break;
        }
        iVar5 = bcmp((void *)local_e8,"capnp",__n);
        auVar10 = local_e8;
joined_r0x0011a829:
        local_e8 = auVar10;
        if (iVar5 != 0) goto LAB_0011a8a7;
        if (auVar10 != (undefined1  [8])0x0) {
          local_e8 = (undefined1  [8])0x0;
          uStack_e0 = (String *)0x0;
          (**local_d8->_vptr_ArrayDisposer)(local_d8,auVar10,1,pSVar7,pSVar7);
        }
        pOVar8 = pOVar8 + 1;
      } while (pOVar8 != pOVar1);
    }
    iVar5 = (**((this->disk).ptr)->_vptr_Filesystem)();
    pDVar11->dir = (ReadableDirectory *)CONCAT44(extraout_var_01,iVar5);
    (pDVar11->path).parts.ptr = local_b8.parts.ptr;
    (pDVar11->path).parts.size_ = local_b8.parts.size_;
    (pDVar11->path).parts.disposer = local_b8.parts.disposer;
    local_b8.parts.ptr = (String *)0x0;
    local_b8.parts.size_ = 0;
  }
LAB_0011a9ac:
  sVar6 = local_b8.parts.size_;
  pSVar7 = local_b8.parts.ptr;
  if (local_b8.parts.ptr != (String *)0x0) {
    local_b8.parts.ptr = (String *)0x0;
    local_b8.parts.size_ = 0;
    (**(local_b8.parts.disposer)->_vptr_ArrayDisposer)
              (local_b8.parts.disposer,pSVar7,0x18,sVar6,sVar6,
               kj::ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  return pDVar11;
}

Assistant:

DirPathPair interpretSourceFile(kj::StringPtr pathStr) {
    auto cwd = disk->getCurrentPath();
    auto path = cwd.evalNative(pathStr);

    KJ_REQUIRE(path.size() > 0);
    for (size_t i = path.size() - 1; i > 0; i--) {
      auto prefix = path.slice(0, i);
      auto remainder = path.slice(i, path.size());

      KJ_IF_SOME(sdir, sourceDirectories.find(prefix)) {
        if (sdir.isSourcePrefix) {
          return { *sdir.dir, remainder.clone() };
        }
      }
    }

    // No source prefix matched. Fall back to heuristic: try stripping the current directory,
    // otherwise don't strip anything.
    if (path.startsWith(cwd)) {
      return { disk->getCurrent(), path.slice(cwd.size(), path.size()).clone() };
    } else {
      // Hmm, no src-prefix matched and the file isn't even in the current directory. This might
      // be OK if we aren't generating any output anyway, but otherwise the results will almost
      // certainly not be what the user wanted. Let's print a warning, unless the output directives
      // are ones which we know do not produce output files. This is a hack.
      for (auto& output: outputs) {
        auto name = kj::str(output.name);
        if (name != "-" && name != "capnp") {
          context.warning(kj::str(pathStr,
              ": File is not in the current directory and does not match any prefix defined with "
              "--src-prefix. Please pass an appropriate --src-prefix so I can figure out where to "
              "write the output for this file."));
          break;
        }
      }

      return { disk->getRoot(), kj::mv(path) };
    }
  }